

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_subcommand.c
# Opt level: O3

REF_STATUS translate(REF_MPI ref_mpi,int argc,char **argv)

{
  char *pcVar1;
  REF_DBL *pRVar2;
  REF_CELL ref_cell;
  double dVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  REF_STATUS RVar8;
  long lVar9;
  long *plVar10;
  size_t sVar11;
  REF_CELL *ppRVar12;
  undefined8 uVar13;
  REF_NODE pRVar14;
  long lVar15;
  char *pcVar16;
  REF_CELL_TYPE type;
  long lVar17;
  REF_GRID_conflict pRVar18;
  double dVar19;
  REF_INT pos;
  REF_GRID_conflict ref_grid;
  REF_DBL deviation;
  REF_DBL total_deviation;
  char *endptr;
  int local_118;
  int local_114;
  REF_GRID_conflict local_110;
  char *local_108;
  double local_f0;
  REF_NODE local_e8;
  double local_e0;
  double local_d8;
  double local_c0;
  double local_b8;
  undefined1 local_b0 [8];
  char *local_a8 [15];
  
  local_110 = (REF_GRID)0x0;
  if (argc < 4) goto LAB_0011b601;
  pcVar16 = argv[2];
  pcVar1 = argv[3];
  ref_mpi_stopwatch_start(ref_mpi);
  if (ref_mpi->n < 2) {
    if (ref_mpi->id == 0) {
      printf("import %s\n",pcVar16);
    }
    uVar4 = ref_import_by_extension(&local_110,ref_mpi,pcVar16);
    if (uVar4 != 0) {
      pcVar16 = "import";
      uVar13 = 0x106d;
      goto LAB_0011b6d6;
    }
    pcVar16 = "import";
  }
  else {
    if (ref_mpi->id == 0) {
      printf("part %s\n",pcVar16);
    }
    uVar4 = ref_part_by_extension(&local_110,ref_mpi,pcVar16);
    if (uVar4 != 0) {
      pcVar16 = "part";
      uVar13 = 0x1069;
      goto LAB_0011b6d6;
    }
    pcVar16 = "part";
  }
  ref_mpi_stopwatch_stop(ref_mpi,pcVar16);
  if (ref_mpi->id == 0) {
    printf("  read %ld vertices\n",local_110->node->old_n_global);
  }
  local_114 = argc;
  uVar5 = ref_args_find(argc,argv,"--scale",&local_118);
  uVar4 = 0;
  if ((uVar5 != 0) && (uVar5 != 5)) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c",
           0x1074,"translate",(ulong)uVar5,"arg search");
    uVar4 = uVar5;
  }
  if ((uVar5 != 5) && (uVar5 != 0)) {
    return uVar4;
  }
  lVar9 = (long)local_118;
  if (lVar9 == -1) {
LAB_0011b84d:
    uVar5 = ref_args_find(local_114,argv,"--shift",&local_118);
    if ((uVar5 != 0) && (uVar5 != 5)) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c",
             0x1089,"translate",(ulong)uVar5,"arg search");
      uVar4 = uVar5;
    }
    if ((uVar5 != 5) && (uVar5 != 0)) {
      return uVar4;
    }
    lVar9 = (long)local_118;
    if (lVar9 != -1) {
      if (local_114 <= local_118 + 3) {
        if (ref_mpi->id != 0) goto LAB_0011b601;
        pcVar16 = "--shift missing dx dy dz";
        goto LAB_0011bdd8;
      }
      pRVar14 = local_110->node;
      local_118 = local_118 + 1;
      pcVar16 = (char *)strtod(argv[lVar9 + 1],local_a8);
      lVar9 = (long)local_118;
      if (argv[lVar9] == local_a8[0]) {
        pcVar16 = "parse dx";
        uVar13 = 0x1095;
        goto LAB_0011be49;
      }
      local_118 = local_118 + 1;
      local_108 = pcVar16;
      dVar19 = strtod(argv[lVar9 + 1],local_a8);
      lVar9 = (long)local_118;
      if (argv[lVar9] == local_a8[0]) {
        pcVar16 = "parse dy";
        uVar13 = 0x1098;
        goto LAB_0011be49;
      }
      local_118 = local_118 + 1;
      local_d8 = dVar19;
      dVar19 = strtod(argv[lVar9 + 1],local_a8);
      if (argv[local_118] == local_a8[0]) {
        pcVar16 = "parse dz";
        uVar13 = 0x109b;
        goto LAB_0011be49;
      }
      if (ref_mpi->id == 0) {
        local_f0 = dVar19;
        printf("--shift %e %e %e\n",local_108,local_d8,dVar19);
        dVar19 = local_f0;
      }
      iVar7 = pRVar14->max;
      if (0 < (long)iVar7) {
        plVar10 = pRVar14->global;
        lVar9 = 0;
        do {
          if (-1 < *plVar10) {
            pRVar2 = pRVar14->real;
            dVar3 = ((double *)((long)pRVar2 + lVar9))[1];
            *(double *)((long)pRVar2 + lVar9) =
                 *(double *)((long)pRVar2 + lVar9) + (double)local_108;
            ((double *)((long)pRVar2 + lVar9))[1] = dVar3 + local_d8;
            *(double *)((long)pRVar2 + lVar9 + 0x10) =
                 *(double *)((long)pRVar2 + lVar9 + 0x10) + dVar19;
          }
          lVar9 = lVar9 + 0x78;
          plVar10 = plVar10 + 1;
        } while ((long)iVar7 * 0x78 - lVar9 != 0);
      }
    }
    uVar5 = ref_args_find(local_114,argv,"--rotatey",&local_118);
    if ((uVar5 != 0) && (uVar5 != 5)) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c",
             0x10a5,"translate",(ulong)uVar5,"arg search");
      uVar4 = uVar5;
    }
    if ((uVar5 != 5) && (uVar5 != 0)) {
      return uVar4;
    }
    lVar9 = (long)local_118;
    if (lVar9 != -1) {
      if (local_114 <= local_118 + 1) {
        if (ref_mpi->id != 0) goto LAB_0011b601;
        pcVar16 = "--rotatey missing degrees";
        goto LAB_0011bdd8;
      }
      local_e8 = local_110->node;
      local_118 = local_118 + 1;
      dVar19 = strtod(argv[lVar9 + 1],local_a8);
      if (argv[local_118] == local_a8[0]) {
        pcVar16 = "parse degree";
        uVar13 = 0x10b1;
LAB_0011be49:
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
               ,uVar13,"translate",pcVar16);
        return 1;
      }
      local_108 = (char *)((dVar19 / 180.0) * 3.14159265358979);
      if (ref_mpi->id == 0) {
        printf("--rotatex %f degree %f radian\n",dVar19,local_108);
      }
      iVar7 = local_e8->max;
      if (0 < iVar7) {
        lVar9 = 0;
        lVar17 = 0;
        pRVar14 = local_e8;
        do {
          if (-1 < pRVar14->global[lVar17]) {
            pRVar2 = pRVar14->real;
            local_d8 = *(double *)((long)pRVar2 + lVar9);
            local_c0 = *(double *)((long)pRVar2 + lVar9 + 8);
            local_f0 = *(double *)((long)pRVar2 + lVar9 + 0x10);
            local_b8 = cos((double)local_108);
            dVar19 = sin((double)local_108);
            pRVar2 = local_e8->real;
            *(double *)((long)pRVar2 + lVar9) = local_b8 * local_d8 - dVar19 * local_f0;
            *(double *)((long)pRVar2 + lVar9 + 8) = local_c0;
            local_c0 = sin((double)local_108);
            dVar19 = cos((double)local_108);
            *(double *)((long)local_e8->real + lVar9 + 0x10) =
                 local_c0 * local_d8 + dVar19 * local_f0;
            iVar7 = local_e8->max;
            pRVar14 = local_e8;
          }
          lVar17 = lVar17 + 1;
          lVar9 = lVar9 + 0x78;
        } while (lVar17 < iVar7);
      }
    }
    uVar5 = ref_args_find(local_114,argv,"--surface",&local_118);
    if ((uVar5 != 0) && (uVar5 != 5)) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c",
             0x10c1,"translate",(ulong)uVar5,"arg search");
      uVar4 = uVar5;
    }
    if ((uVar5 != 5) && (uVar5 != 0)) {
      return uVar4;
    }
    local_d8 = (double)CONCAT44(local_d8._4_4_,local_118);
    local_108 = pcVar1;
    if (local_118 != -1) {
      if (ref_mpi->id == 0) {
        puts("  --surface deleting 3D cells");
      }
      ppRVar12 = local_110->cell + 8;
      type = REF_CELL_TET;
      lVar9 = 0x50;
      do {
        uVar5 = ref_cell_free(*ppRVar12);
        if (uVar5 != 0) {
          pcVar16 = "free cell";
          uVar13 = 0x10c8;
          goto LAB_0011bf5c;
        }
        uVar5 = ref_cell_create((REF_CELL *)((long)local_110->cell + lVar9 + -0x10),type);
        if (uVar5 != 0) {
          pcVar16 = "empty cell create";
          uVar13 = 0x10cb;
          goto LAB_0011bf5c;
        }
        type = type + REF_CELL_ED2;
        lVar17 = lVar9 + 8;
        ppRVar12 = (REF_CELL *)((long)local_110->cell + lVar9 + -8);
        lVar9 = lVar17;
      } while (lVar17 != 0x90);
    }
    uVar5 = ref_args_find(local_114,argv,"--orient",&local_118);
    if ((uVar5 != 0) && (uVar5 != 5)) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c",
             0x10d0,"translate",(ulong)uVar5,"arg search");
      uVar4 = uVar5;
    }
    iVar7 = local_114;
    if ((uVar5 != 5) && (uVar5 != 0)) {
      return uVar4;
    }
    if (local_118 != -1) {
      if (ref_mpi->id == 0) {
        puts("  --orient twod in place");
      }
      uVar5 = ref_grid_orient_twod(local_110);
      if (uVar5 != 0) {
        pcVar16 = "orient twod";
        uVar13 = 0x10d3;
        goto LAB_0011bf5c;
      }
    }
    uVar5 = ref_args_find(iVar7,argv,"--shard",&local_118);
    if ((uVar5 != 0) && (uVar5 != 5)) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c",
             0x10d6,"translate",(ulong)uVar5,"arg search");
      uVar4 = uVar5;
    }
    iVar7 = local_114;
    if ((uVar5 != 5) && (uVar5 != 0)) {
      return uVar4;
    }
    if (local_118 != -1) {
      if (ref_mpi->id == 0) {
        puts("  --shard in place");
      }
      uVar5 = ref_shard_in_place(local_110);
      if (uVar5 != 0) {
        pcVar16 = "shard to simplex";
        uVar13 = 0x10d9;
        goto LAB_0011bf5c;
      }
    }
    uVar5 = ref_args_find(iVar7,argv,"--blockhead",&local_118);
    if ((uVar5 != 0) && (uVar5 != 5)) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c",
             0x10dd,"translate",(ulong)uVar5,"arg search");
      uVar4 = uVar5;
    }
    iVar7 = local_114;
    if ((uVar5 != 5) && (uVar5 != 0)) {
      return uVar4;
    }
    if (local_118 != -1) {
      if (ref_mpi->id == 0) {
        puts("  --blockhead in place");
      }
      uVar5 = ref_subdiv_to_hex(local_110);
      if (uVar5 != 0) {
        pcVar16 = "shard to simplex";
        uVar13 = 0x10e0;
        goto LAB_0011bf5c;
      }
    }
    uVar5 = ref_args_find(iVar7,argv,"--enrich2",&local_118);
    if ((uVar5 != 0) && (uVar5 != 5)) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c",
             0x10e4,"translate",(ulong)uVar5,"arg search");
      uVar4 = uVar5;
    }
    if ((uVar5 != 5) && (uVar5 != 0)) {
      return uVar4;
    }
    if (local_118 != -1) {
      if (ref_mpi->id == 0) {
        puts("  --enrich2");
      }
      uVar5 = ref_geom_enrich2(local_110);
      if (uVar5 != 0) {
        pcVar16 = "enrich to q2";
        uVar13 = 0x10e7;
        goto LAB_0011bf5c;
      }
    }
    uVar5 = ref_args_find(local_114,argv,"--extrude",&local_118);
    if ((uVar5 != 0) && (uVar5 != 5)) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c",
             0x10eb,"translate",(ulong)uVar5,"arg search");
      uVar4 = uVar5;
    }
    iVar7 = local_118;
    if ((uVar5 != 5) && (uVar5 != 0)) {
      return uVar4;
    }
    uVar5 = ref_args_find(local_114,argv,"--planes",&local_118);
    if ((uVar5 != 0) && (uVar5 != 5)) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c",
             0x10f0,"translate",(ulong)uVar5,"arg search");
      uVar4 = uVar5;
    }
    pRVar18 = local_110;
    if ((uVar5 != 5) && (uVar5 != 0)) {
      return uVar4;
    }
    if ((long)local_118 == -1 || iVar7 == -1) {
      if (local_118 == -1) {
        sVar11 = strlen(local_108);
        pRVar18 = local_110;
        if ((sVar11 < 6 || local_110->twod == 0) ||
           (iVar6 = strncmp(local_108 + (sVar11 - 6),".ugrid",6), iVar6 != 0)) goto LAB_0011c25b;
        if (ref_mpi->id == 0) {
          puts("  --extrude implicitly added to ugrid output of 2D input.");
          goto LAB_0011c265;
        }
LAB_0011c2f8:
        uVar5 = ref_grid_extrude_twod(&local_110,pRVar18,2);
        if (uVar5 != 0) {
          pcVar16 = "extrude";
          uVar13 = 0x1113;
          goto LAB_0011bf5c;
        }
        uVar5 = ref_grid_free(pRVar18);
        if (uVar5 != 0) {
          pcVar16 = "free";
          uVar13 = 0x1114;
          goto LAB_0011bf5c;
        }
      }
      else {
        if (local_114 <= local_118 + 1) {
          if (ref_mpi->id != 0) goto LAB_0011b601;
          pcVar16 = "--planes missing N";
          goto LAB_0011bdd8;
        }
        uVar5 = atoi(argv[(long)local_118 + 1]);
        if ((int)uVar5 < 2) {
          if (ref_mpi->id == 0) {
            printf("--planes %d must be 2 or more\n",(ulong)uVar5);
          }
          goto LAB_0011b601;
        }
        if (ref_mpi->id == 0) {
          printf("extrude %d layers of prisms\n",(ulong)uVar5);
        }
        uVar5 = ref_grid_extrude_twod(&local_110,pRVar18,uVar5);
        if (uVar5 != 0) {
          pcVar16 = "extrude";
          uVar13 = 0x1104;
LAB_0011c564:
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                 ,uVar13,"translate",(ulong)uVar5,pcVar16);
          return uVar5;
        }
        uVar5 = ref_grid_free(pRVar18);
        if (uVar5 != 0) {
          pcVar16 = "free";
          uVar13 = 0x1105;
          goto LAB_0011c564;
        }
LAB_0011c25b:
        if (iVar7 != -1) {
LAB_0011c265:
          pRVar18 = local_110;
          if (ref_mpi->id == 0) {
            puts("extrude prisms");
          }
          goto LAB_0011c2f8;
        }
      }
      uVar5 = ref_args_find(local_114,argv,"--zero-y-face",&local_118);
      if ((uVar5 != 0) && (uVar5 != 5)) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
               ,0x1118,"translate",(ulong)uVar5,"arg search");
        uVar4 = uVar5;
      }
      pRVar18 = local_110;
      if ((uVar5 != 5) && (uVar5 != 0)) {
        return uVar4;
      }
      if ((long)local_118 != -1) {
        if (local_114 <= local_118 + 1) {
          if (ref_mpi->id != 0) goto LAB_0011b601;
          pcVar16 = "--zero-y-face missing faceid";
          goto LAB_0011bdd8;
        }
        local_e8 = local_110->node;
        iVar7 = atoi(argv[(long)local_118 + 1]);
        local_f0 = (double)CONCAT44(local_f0._4_4_,iVar7);
        if (ref_mpi->id == 0) {
          printf("zero y of face %d\n",iVar7);
          pRVar18 = local_110;
        }
        local_e0 = 0.0;
        ppRVar12 = pRVar18->cell + 3;
        lVar9 = 3;
        do {
          ref_cell = *ppRVar12;
          if (0 < ref_cell->max) {
            iVar7 = 0;
            do {
              RVar8 = ref_cell_nodes(ref_cell,iVar7,(REF_INT *)local_a8);
              if (RVar8 == 0) {
                iVar6 = ref_cell->node_per;
                if ((local_f0._0_4_ == *(int *)((long)local_a8 + (long)iVar6 * 4)) && (0 < iVar6)) {
                  pRVar2 = local_e8->real;
                  lVar17 = 0;
                  do {
                    lVar15 = (long)*(int *)((long)local_a8 + lVar17 * 4);
                    dVar19 = pRVar2[lVar15 * 0xf + 1];
                    if (dVar19 <= -dVar19) {
                      dVar19 = -dVar19;
                    }
                    if (local_e0 <= dVar19) {
                      local_e0 = dVar19;
                    }
                    pRVar2[lVar15 * 0xf + 1] = 0.0;
                    lVar17 = lVar17 + 1;
                  } while (iVar6 != lVar17);
                }
              }
              iVar7 = iVar7 + 1;
              pRVar18 = local_110;
            } while (iVar7 < ref_cell->max);
          }
          ppRVar12 = pRVar18->cell + lVar9 + 1;
          lVar9 = lVar9 + 1;
        } while (lVar9 != 8);
        uVar5 = ref_mpi_max(ref_mpi,&local_e0,local_b0,3);
        if (uVar5 != 0) {
          pcVar16 = "mpi max";
          uVar13 = 0x1131;
LAB_0011bf5c:
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                 ,uVar13,"translate",(ulong)uVar5,pcVar16);
          return uVar5;
        }
        if (ref_mpi->id == 0) {
          printf("max deviation %e\n",local_e0);
        }
      }
      uVar5 = ref_args_find(local_114,argv,"--axi",&local_118);
      if ((uVar5 != 0) && (uVar5 != 5)) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
               ,0x1135,"translate",(ulong)uVar5,"arg search");
        uVar4 = uVar5;
      }
      if ((uVar5 != 5) && (uVar5 != 0)) {
        return uVar4;
      }
      if (local_118 != -1) {
        if (ref_mpi->id == 0) {
          puts("--axi creates wedge about y=z=0 axis");
        }
        uVar4 = ref_axi_wedge(local_110);
        if (uVar4 != 0) {
          pcVar16 = "wedge";
          uVar13 = 0x1138;
          goto LAB_0011b6d6;
        }
      }
      iVar7 = ref_mpi->id;
      if (ref_mpi->n < 2) {
        if (local_d8._0_4_ == -1) {
          if (iVar7 == 0) {
            printf("export %ld nodes to %s\n",local_110->node->old_n_global,local_108);
          }
        }
        else if (iVar7 == 0) {
          printf("export surface to %s\n",local_108);
        }
        uVar4 = ref_export_by_extension(local_110,local_108);
        if (uVar4 != 0) {
          pcVar16 = "export";
          uVar13 = 0x114d;
          goto LAB_0011b6d6;
        }
        pcVar16 = "export";
      }
      else {
        if (local_d8._0_4_ == -1) {
          if (iVar7 == 0) {
            printf("gather %ld nodes to %s\n",local_110->node->old_n_global,local_108);
          }
        }
        else if (iVar7 == 0) {
          printf("gather surface to %s\n",local_108);
        }
        uVar4 = ref_gather_by_extension(local_110,local_108);
        if (uVar4 != 0) {
          pcVar16 = "gather";
          uVar13 = 0x1143;
          goto LAB_0011b6d6;
        }
        pcVar16 = "gather";
      }
      ref_mpi_stopwatch_stop(ref_mpi,pcVar16);
      uVar4 = ref_grid_free(local_110);
      if (uVar4 == 0) {
        return 0;
      }
      pcVar16 = "free grid";
      uVar13 = 0x1151;
LAB_0011b6d6:
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c",
             uVar13,"translate",(ulong)uVar4,pcVar16);
      return uVar4;
    }
    if (ref_mpi->id != 0) goto LAB_0011b601;
    pcVar16 = "--extrude and --planes exclusive";
  }
  else {
    if (local_118 + 1 < local_114) {
      pRVar14 = local_110->node;
      local_118 = local_118 + 1;
      pcVar16 = (char *)strtod(argv[lVar9 + 1],local_a8);
      if (argv[local_118] == local_a8[0]) {
        pcVar16 = "parse scale";
        uVar13 = 0x1080;
        goto LAB_0011be49;
      }
      if (ref_mpi->id == 0) {
        local_108 = pcVar16;
        printf("--scale %e\n");
        pcVar16 = local_108;
      }
      iVar7 = pRVar14->max;
      if (0 < (long)iVar7) {
        plVar10 = pRVar14->global;
        lVar9 = 0;
        do {
          if (-1 < *plVar10) {
            pRVar2 = pRVar14->real;
            dVar19 = ((double *)((long)pRVar2 + lVar9))[1];
            *(double *)((long)pRVar2 + lVar9) = *(double *)((long)pRVar2 + lVar9) * (double)pcVar16;
            ((double *)((long)pRVar2 + lVar9))[1] = dVar19 * (double)pcVar16;
            *(double *)((long)pRVar2 + lVar9 + 0x10) =
                 *(double *)((long)pRVar2 + lVar9 + 0x10) * (double)pcVar16;
          }
          lVar9 = lVar9 + 0x78;
          plVar10 = plVar10 + 1;
        } while ((long)iVar7 * 0x78 - lVar9 != 0);
      }
      goto LAB_0011b84d;
    }
    if (ref_mpi->id != 0) goto LAB_0011b601;
    pcVar16 = "--scale missing scale";
  }
LAB_0011bdd8:
  puts(pcVar16);
LAB_0011b601:
  if (ref_mpi->id != 0) {
    return 1;
  }
  translate_help(*argv);
  return 1;
}

Assistant:

static REF_STATUS translate(REF_MPI ref_mpi, int argc, char *argv[]) {
  char *out_file;
  char *in_file;
  REF_GRID ref_grid = NULL;
  REF_INT pos;
  REF_BOOL extrude = REF_FALSE;
  REF_BOOL surface_only = REF_FALSE;
  size_t end_of_string;

  if (argc < 4) goto shutdown;
  in_file = argv[2];
  out_file = argv[3];

  ref_mpi_stopwatch_start(ref_mpi);

  if (ref_mpi_para(ref_mpi)) {
    if (ref_mpi_once(ref_mpi)) printf("part %s\n", in_file);
    RSS(ref_part_by_extension(&ref_grid, ref_mpi, in_file), "part");
    ref_mpi_stopwatch_stop(ref_mpi, "part");
  } else {
    if (ref_mpi_once(ref_mpi)) printf("import %s\n", in_file);
    RSS(ref_import_by_extension(&ref_grid, ref_mpi, in_file), "import");
    ref_mpi_stopwatch_stop(ref_mpi, "import");
  }
  if (ref_mpi_once(ref_mpi))
    printf("  read " REF_GLOB_FMT " vertices\n",
           ref_node_n_global(ref_grid_node(ref_grid)));

  RXS(ref_args_find(argc, argv, "--scale", &pos), REF_NOT_FOUND, "arg search");
  if (REF_EMPTY != pos) {
    char *endptr;
    REF_DBL scale;
    REF_NODE ref_node = ref_grid_node(ref_grid);
    REF_INT node;
    if (pos + 1 >= argc) {
      if (ref_mpi_once(ref_mpi)) printf("--scale missing scale\n");
      goto shutdown;
    }
    pos++;
    scale = strtod(argv[pos], &endptr);
    RAS(argv[pos] != endptr, "parse scale");
    if (ref_mpi_once(ref_mpi)) printf("--scale %e\n", scale);
    each_ref_node_valid_node(ref_node, node) {
      ref_node_xyz(ref_node, 0, node) *= scale;
      ref_node_xyz(ref_node, 1, node) *= scale;
      ref_node_xyz(ref_node, 2, node) *= scale;
    }
  }

  RXS(ref_args_find(argc, argv, "--shift", &pos), REF_NOT_FOUND, "arg search");
  if (REF_EMPTY != pos) {
    char *endptr;
    REF_DBL dx, dy, dz;
    REF_NODE ref_node = ref_grid_node(ref_grid);
    REF_INT node;
    if (pos + 3 >= argc) {
      if (ref_mpi_once(ref_mpi)) printf("--shift missing dx dy dz\n");
      goto shutdown;
    }
    pos++;
    dx = strtod(argv[pos], &endptr);
    RAS(argv[pos] != endptr, "parse dx");
    pos++;
    dy = strtod(argv[pos], &endptr);
    RAS(argv[pos] != endptr, "parse dy");
    pos++;
    dz = strtod(argv[pos], &endptr);
    RAS(argv[pos] != endptr, "parse dz");
    if (ref_mpi_once(ref_mpi)) printf("--shift %e %e %e\n", dx, dy, dz);
    each_ref_node_valid_node(ref_node, node) {
      ref_node_xyz(ref_node, 0, node) += dx;
      ref_node_xyz(ref_node, 1, node) += dy;
      ref_node_xyz(ref_node, 2, node) += dz;
    }
  }

  RXS(ref_args_find(argc, argv, "--rotatey", &pos), REF_NOT_FOUND,
      "arg search");
  if (REF_EMPTY != pos) {
    char *endptr;
    REF_DBL degree, rad;
    REF_NODE ref_node = ref_grid_node(ref_grid);
    REF_INT node;
    if (pos + 1 >= argc) {
      if (ref_mpi_once(ref_mpi)) printf("--rotatey missing degrees\n");
      goto shutdown;
    }
    pos++;
    degree = strtod(argv[pos], &endptr);
    RAS(argv[pos] != endptr, "parse degree");
    rad = ref_math_in_radians(degree);
    if (ref_mpi_once(ref_mpi))
      printf("--rotatex %f degree %f radian\n", degree, rad);
    each_ref_node_valid_node(ref_node, node) {
      REF_DBL x, y, z;
      x = ref_node_xyz(ref_node, 0, node);
      y = ref_node_xyz(ref_node, 1, node);
      z = ref_node_xyz(ref_node, 2, node);
      ref_node_xyz(ref_node, 0, node) = x * cos(rad) - z * sin(rad);
      ref_node_xyz(ref_node, 1, node) = y;
      ref_node_xyz(ref_node, 2, node) = x * sin(rad) + z * cos(rad);
    }
  }

  RXS(ref_args_find(argc, argv, "--surface", &pos), REF_NOT_FOUND,
      "arg search");
  if (REF_EMPTY != pos) {
    REF_INT group;
    REF_CELL ref_cell;
    if (ref_mpi_once(ref_mpi)) printf("  --surface deleting 3D cells\n");
    surface_only = REF_TRUE;
    each_ref_grid_3d_ref_cell(ref_grid, group, ref_cell) {
      RSS(ref_cell_free(ref_cell), "free cell");
      RSS(ref_cell_create(&ref_grid_cell(ref_grid, group),
                          (REF_CELL_TYPE)group),
          "empty cell create");
      ref_cell = ref_grid_cell(ref_grid, group);
    }
  }

  RXS(ref_args_find(argc, argv, "--orient", &pos), REF_NOT_FOUND, "arg search");
  if (REF_EMPTY != pos) {
    if (ref_mpi_once(ref_mpi)) printf("  --orient twod in place\n");
    RSS(ref_grid_orient_twod(ref_grid), "orient twod");
  }

  RXS(ref_args_find(argc, argv, "--shard", &pos), REF_NOT_FOUND, "arg search");
  if (REF_EMPTY != pos) {
    if (ref_mpi_once(ref_mpi)) printf("  --shard in place\n");
    RSS(ref_shard_in_place(ref_grid), "shard to simplex");
  }

  RXS(ref_args_find(argc, argv, "--blockhead", &pos), REF_NOT_FOUND,
      "arg search");
  if (REF_EMPTY != pos) {
    if (ref_mpi_once(ref_mpi)) printf("  --blockhead in place\n");
    RSS(ref_subdiv_to_hex(ref_grid), "shard to simplex");
  }

  RXS(ref_args_find(argc, argv, "--enrich2", &pos), REF_NOT_FOUND,
      "arg search");
  if (REF_EMPTY != pos) {
    if (ref_mpi_once(ref_mpi)) printf("  --enrich2\n");
    RSS(ref_geom_enrich2(ref_grid), "enrich to q2");
  }

  RXS(ref_args_find(argc, argv, "--extrude", &pos), REF_NOT_FOUND,
      "arg search");
  if (REF_EMPTY != pos) {
    extrude = REF_TRUE;
  }

  RXS(ref_args_find(argc, argv, "--planes", &pos), REF_NOT_FOUND, "arg search");
  if (REF_EMPTY != pos && extrude) {
    if (ref_mpi_once(ref_mpi)) printf("--extrude and --planes exclusive\n");
    goto shutdown;
  }
  if (REF_EMPTY != pos) {
    REF_GRID twod_grid = ref_grid;
    REF_INT n_planes;
    if (pos + 1 >= argc) {
      if (ref_mpi_once(ref_mpi)) printf("--planes missing N\n");
      goto shutdown;
    }
    n_planes = atoi(argv[pos + 1]);
    if (n_planes < 2) {
      if (ref_mpi_once(ref_mpi))
        printf("--planes %d must be 2 or more\n", n_planes);
      goto shutdown;
    }
    if (ref_mpi_once(ref_mpi))
      printf("extrude %d layers of prisms\n", n_planes);
    RSS(ref_grid_extrude_twod(&ref_grid, twod_grid, n_planes), "extrude");
    RSS(ref_grid_free(twod_grid), "free");
  } else {
    end_of_string = strlen(out_file);
    if (ref_grid_twod(ref_grid) && (end_of_string >= 6) &&
        (strncmp(&out_file[end_of_string - 6], ".ugrid", 6)) == 0) {
      extrude = REF_TRUE;
      if (ref_mpi_once(ref_mpi))
        printf("  --extrude implicitly added to ugrid output of 2D input.\n");
    }
  }

  if (extrude) {
    REF_GRID twod_grid = ref_grid;
    if (ref_mpi_once(ref_mpi)) printf("extrude prisms\n");
    RSS(ref_grid_extrude_twod(&ref_grid, twod_grid, 2), "extrude");
    RSS(ref_grid_free(twod_grid), "free");
  }

  RXS(ref_args_find(argc, argv, "--zero-y-face", &pos), REF_NOT_FOUND,
      "arg search");
  if (REF_EMPTY != pos) {
    REF_DBL deviation, total_deviation;
    REF_CELL ref_cell;
    REF_NODE ref_node = ref_grid_node(ref_grid);
    REF_INT faceid, group, cell, node, nodes[REF_CELL_MAX_SIZE_PER];
    if (pos + 1 >= argc) {
      if (ref_mpi_once(ref_mpi)) printf("--zero-y-face missing faceid\n");
      goto shutdown;
    }
    faceid = atoi(argv[pos + 1]);
    if (ref_mpi_once(ref_mpi)) printf("zero y of face %d\n", faceid);
    deviation = 0.0;
    each_ref_grid_2d_ref_cell(ref_grid, group, ref_cell) {
      each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
        if (faceid == nodes[ref_cell_node_per(ref_cell)]) {
          each_ref_cell_cell_node(ref_cell, node) {
            deviation =
                MAX(deviation, ABS(ref_node_xyz(ref_node, 1, nodes[node])));
            ref_node_xyz(ref_node, 1, nodes[node]) = 0.0;
          }
        }
      }
    }
    RSS(ref_mpi_max(ref_mpi, &deviation, &total_deviation, REF_DBL_TYPE),
        "mpi max");
    if (ref_mpi_once(ref_mpi)) printf("max deviation %e\n", deviation);
  }

  RXS(ref_args_find(argc, argv, "--axi", &pos), REF_NOT_FOUND, "arg search");
  if (REF_EMPTY != pos) {
    if (ref_mpi_once(ref_mpi)) printf("--axi creates wedge about y=z=0 axis\n");
    RSS(ref_axi_wedge(ref_grid), "wedge");
  }

  if (ref_mpi_para(ref_mpi)) {
    if (surface_only) {
      if (ref_mpi_once(ref_mpi)) printf("gather surface to %s\n", out_file);
    } else {
      if (ref_mpi_once(ref_mpi))
        printf("gather " REF_GLOB_FMT " nodes to %s\n",
               ref_node_n_global(ref_grid_node(ref_grid)), out_file);
    }
    RSS(ref_gather_by_extension(ref_grid, out_file), "gather");
    ref_mpi_stopwatch_stop(ref_mpi, "gather");
  } else {
    if (surface_only) {
      if (ref_mpi_once(ref_mpi)) printf("export surface to %s\n", out_file);
    } else {
      if (ref_mpi_once(ref_mpi))
        printf("export " REF_GLOB_FMT " nodes to %s\n",
               ref_node_n_global(ref_grid_node(ref_grid)), out_file);
    }
    RSS(ref_export_by_extension(ref_grid, out_file), "export");
    ref_mpi_stopwatch_stop(ref_mpi, "export");
  }

  RSS(ref_grid_free(ref_grid), "free grid");

  return REF_SUCCESS;
shutdown:
  if (ref_mpi_once(ref_mpi)) translate_help(argv[0]);
  return REF_FAILURE;
}